

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O2

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::setFromConstTriplets
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,Triplets *triplets)

{
  Triplets copy;
  _Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_> _Stack_28;
  
  std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::vector
            ((vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_> *)&_Stack_28,
             &triplets->m_triplets);
  setFromTriplets(this,(Triplets *)&_Stack_28);
  std::_Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::~_Vector_base
            (&_Stack_28);
  return;
}

Assistant:

void SparseMatrix<ordering>::setFromConstTriplets(const iDynTree::Triplets& triplets)
    {
        iDynTree::Triplets copy(triplets);
        setFromTriplets(copy);
    }